

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

void LogConnectFailure<std::__cxx11::string,std::__cxx11::string>
               (bool manual_connection,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  long lVar1;
  bool bVar2;
  Logger *this;
  undefined7 in_register_00000039;
  int source_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  LogFlags flag;
  Level level;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string error_message;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&error_message,(tinyformat *)fmt,(char *)args,args_1,in_R8);
  if ((int)CONCAT71(in_register_00000039,manual_connection) == 0) {
    this = LogInstance();
    flag = NET;
    level = Debug;
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this,NET,Debug);
    source_line = 0x235;
    if (!bVar2) goto LAB_00d7c433;
  }
  else {
    level = Info;
    flag = ALL;
    source_line = 0x233;
  }
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
  source_file._M_len = 0x54;
  logging_function._M_str = "LogConnectFailure";
  logging_function._M_len = 0x11;
  LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,source_line,flag,level,"%s\n",&error_message);
LAB_00d7c433:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != &error_message.field_2) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void LogConnectFailure(bool manual_connection, const char* fmt, const Args&... args) {
    std::string error_message = tfm::format(fmt, args...);
    if (manual_connection) {
        LogPrintf("%s\n", error_message);
    } else {
        LogDebug(BCLog::NET, "%s\n", error_message);
    }
}